

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec.h
# Opt level: O0

Vec<Hpipe::CharItem_*> * __thiscall
Hpipe::Vec<Hpipe::CharItem_*>::operator<<(Vec<Hpipe::CharItem_*> *this,CharItem **val)

{
  CharItem **val_local;
  Vec<Hpipe::CharItem_*> *this_local;
  
  std::vector<Hpipe::CharItem*,std::allocator<Hpipe::CharItem*>>::
  emplace_back<Hpipe::CharItem*const&>
            ((vector<Hpipe::CharItem*,std::allocator<Hpipe::CharItem*>> *)this,val);
  return this;
}

Assistant:

Vec     &operator<<           ( const T &val ) { this->emplace_back( val ); return *this; }